

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.h
# Opt level: O2

void __thiscall xmrig::SelfSelectClient::onLoginSuccess(SelfSelectClient *this,IClient *param_1)

{
  (*this->m_listener->_vptr_IClientListener[5])(this->m_listener,this);
  if (this->m_state != IdleState) {
    this->m_timestamp = 0;
    this->m_failures = 0;
    this->m_state = IdleState;
  }
  this->m_active = true;
  return;
}

Assistant:

inline void onLoginSuccess(IClient *) override                                                  { m_listener->onLoginSuccess(this); setState(IdleState); m_active = true; }